

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O3

void QDBusMenuItem::registerDBusTypes(void)

{
  QDBusMetaType::registerMarshallOperators
            ((QMetaType)0x7f90e8,
             qDBusRegisterMetaType<QDBusMenuItem>::anon_class_1_0_00000001::__invoke,
             qDBusRegisterMetaType<QDBusMenuItem>::anon_class_1_0_00000001::__invoke);
  QDBusMetaType::registerMarshallOperators
            ((QMetaType)0x7f8c88,
             qDBusRegisterMetaType<QList<QDBusMenuItem>_>::anon_class_1_0_00000001::__invoke,
             qDBusRegisterMetaType<QList<QDBusMenuItem>_>::anon_class_1_0_00000001::__invoke);
  QDBusMetaType::registerMarshallOperators
            ((QMetaType)0x7f9158,
             qDBusRegisterMetaType<QDBusMenuItemKeys>::anon_class_1_0_00000001::__invoke,
             qDBusRegisterMetaType<QDBusMenuItemKeys>::anon_class_1_0_00000001::__invoke);
  QDBusMetaType::registerMarshallOperators
            ((QMetaType)0x7f8cf8,
             qDBusRegisterMetaType<QList<QDBusMenuItemKeys>_>::anon_class_1_0_00000001::__invoke,
             qDBusRegisterMetaType<QList<QDBusMenuItemKeys>_>::anon_class_1_0_00000001::__invoke);
  QDBusMetaType::registerMarshallOperators
            ((QMetaType)0x7f91c8,
             qDBusRegisterMetaType<QDBusMenuLayoutItem>::anon_class_1_0_00000001::__invoke,
             qDBusRegisterMetaType<QDBusMenuLayoutItem>::anon_class_1_0_00000001::__invoke);
  QDBusMetaType::registerMarshallOperators
            ((QMetaType)0x7f9238,
             qDBusRegisterMetaType<QList<QDBusMenuLayoutItem>_>::anon_class_1_0_00000001::__invoke,
             qDBusRegisterMetaType<QList<QDBusMenuLayoutItem>_>::anon_class_1_0_00000001::__invoke);
  QDBusMetaType::registerMarshallOperators
            ((QMetaType)0x7f92a8,
             qDBusRegisterMetaType<QDBusMenuEvent>::anon_class_1_0_00000001::__invoke,
             qDBusRegisterMetaType<QDBusMenuEvent>::anon_class_1_0_00000001::__invoke);
  QDBusMetaType::registerMarshallOperators
            ((QMetaType)0x7f8d68,
             qDBusRegisterMetaType<QList<QDBusMenuEvent>_>::anon_class_1_0_00000001::__invoke,
             qDBusRegisterMetaType<QList<QDBusMenuEvent>_>::anon_class_1_0_00000001::__invoke);
  QDBusMetaType::registerMarshallOperators
            ((QMetaType)0x7f9318,
             qDBusRegisterMetaType<QList<QList<QString>_>_>::anon_class_1_0_00000001::__invoke,
             qDBusRegisterMetaType<QList<QList<QString>_>_>::anon_class_1_0_00000001::__invoke);
  return;
}

Assistant:

void QDBusMenuItem::registerDBusTypes()
{
    qDBusRegisterMetaType<QDBusMenuItem>();
    qDBusRegisterMetaType<QDBusMenuItemList>();
    qDBusRegisterMetaType<QDBusMenuItemKeys>();
    qDBusRegisterMetaType<QDBusMenuItemKeysList>();
    qDBusRegisterMetaType<QDBusMenuLayoutItem>();
    qDBusRegisterMetaType<QDBusMenuLayoutItemList>();
    qDBusRegisterMetaType<QDBusMenuEvent>();
    qDBusRegisterMetaType<QDBusMenuEventList>();
    qDBusRegisterMetaType<QDBusMenuShortcut>();
}